

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

int base64_encode_block(char *plaintext_in,int length_in,char *code_out,base64_encodestate *state_in
                       )

{
  byte bVar1;
  base64_encodestep bVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  byte local_49;
  char fragment;
  char *pcStack_48;
  char result;
  char *codechar;
  char *plaintextend;
  char *plainchar;
  base64_encodestate *state_in_local;
  char *code_out_local;
  int length_in_local;
  char *plaintext_in_local;
  
  pcVar6 = plaintext_in + length_in;
  local_49 = state_in->result;
  bVar2 = state_in->step;
  iVar3 = (int)code_out;
  pcVar4 = code_out;
  plaintextend = plaintext_in;
  if (bVar2 == step_A) goto LAB_00124400;
  pcStack_48 = code_out;
  plaintextend = plaintext_in;
  if (bVar2 == step_B) goto LAB_0012447d;
  pcStack_48 = code_out;
  plaintextend = plaintext_in;
  if (bVar2 == step_C) {
    while (plaintextend != pcVar6) {
      pcVar7 = plaintextend + 1;
      bVar1 = *plaintextend;
      cVar5 = base64url_encode_value(local_49 | (byte)((int)((int)(char)bVar1 & 0xc0U) >> 6));
      *pcStack_48 = cVar5;
      local_49 = bVar1 & 0x3f;
      cVar5 = base64url_encode_value(local_49);
      pcStack_48[1] = cVar5;
      state_in->stepcount = state_in->stepcount + 1;
      pcVar4 = pcStack_48 + 2;
      plaintextend = pcVar7;
      if (state_in->stepcount == 0x12) {
        pcStack_48[2] = '\n';
        state_in->stepcount = 0;
        pcVar4 = pcStack_48 + 3;
      }
LAB_00124400:
      pcStack_48 = pcVar4;
      if (plaintextend == pcVar6) {
        state_in->result = local_49;
        state_in->step = step_A;
        return (int)pcStack_48 - iVar3;
      }
      bVar1 = *plaintextend;
      cVar5 = base64url_encode_value((char)((int)((int)(char)bVar1 & 0xfcU) >> 2));
      *pcStack_48 = cVar5;
      local_49 = (bVar1 & 3) << 4;
      pcStack_48 = pcStack_48 + 1;
      plaintextend = plaintextend + 1;
LAB_0012447d:
      if (plaintextend == pcVar6) {
        state_in->result = local_49;
        state_in->step = step_B;
        return (int)pcStack_48 - iVar3;
      }
      bVar1 = *plaintextend;
      cVar5 = base64url_encode_value(local_49 | (byte)((int)((int)(char)bVar1 & 0xf0U) >> 4));
      *pcStack_48 = cVar5;
      local_49 = (bVar1 & 0xf) << 2;
      pcStack_48 = pcStack_48 + 1;
      plaintextend = plaintextend + 1;
    }
    state_in->result = local_49;
    state_in->step = step_C;
    plaintext_in_local._4_4_ = (int)pcStack_48 - iVar3;
  }
  else {
    plaintext_in_local._4_4_ = 0;
  }
  return plaintext_in_local._4_4_;
}

Assistant:

int base64_encode_block(const char* plaintext_in, int length_in, char* code_out, base64_encodestate* state_in)
{
	const char* plainchar = plaintext_in;
	const char* const plaintextend = plaintext_in + length_in;
	char* codechar = code_out;
	char result;
	char fragment;
	
	result = state_in->result;
	
	switch (state_in->step)
	{
		while (1)
		{
	case step_A:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_A;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result = (fragment & 0x0fc) >> 2;
			*codechar++ = base64url_encode_value(result);
			result = (fragment & 0x003) << 4;
	case step_B:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_B;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result |= (fragment & 0x0f0) >> 4;
			*codechar++ = base64url_encode_value(result);
			result = (fragment & 0x00f) << 2;
	case step_C:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_C;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result |= (fragment & 0x0c0) >> 6;
			*codechar++ = base64url_encode_value(result);
			result  = (fragment & 0x03f) >> 0;
			*codechar++ = base64url_encode_value(result);
			
			++(state_in->stepcount);
			if (state_in->stepcount == CHARS_PER_LINE/4)
			{
				*codechar++ = '\n';
				state_in->stepcount = 0;
			}
		}
	}
	/* control should not reach here */
	return codechar - code_out;
}